

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  ulong uVar1;
  Layer *pLVar2;
  float *pfVar3;
  long in_RSI;
  Mat *in_RDI;
  Mat weights_1 [1];
  Mat weights [2];
  ParamDict pd_4;
  int num_input;
  int kernel_size;
  ParamDict pd_3;
  ParamDict pd_2;
  ParamDict pd_1;
  ParamDict pd;
  Mat *in_stack_ffffffffffffd0c8;
  Mat *in_stack_ffffffffffffd0d0;
  undefined4 in_stack_ffffffffffffd0d8;
  int in_stack_ffffffffffffd0dc;
  Convolution_x86 *in_stack_ffffffffffffd0e0;
  Mat *local_2ef8;
  ParamDict *in_stack_ffffffffffffd110;
  long *plVar4;
  Mat *local_2ed0;
  undefined1 *local_2e90;
  Mat *local_2e68;
  float *in_stack_ffffffffffffd1d0;
  Mat *in_stack_ffffffffffffd1d8;
  Mat *in_stack_ffffffffffffd1e8;
  Mat *in_stack_ffffffffffffd1f0;
  Mat local_2e08;
  undefined1 local_2dc8 [144];
  undefined1 auStack_2d38 [2312];
  int local_2430;
  int local_242c;
  undefined1 local_2428 [2304];
  ParamDict local_1b28;
  ParamDict local_1228;
  Mat local_918 [36];
  long local_18;
  int local_4;
  
  local_18 = in_RSI;
  if (*(int *)((long)&in_RDI[3].c + *(long *)((long)in_RDI->data + -0x18)) == 1) {
    pLVar2 = create_layer(in_stack_ffffffffffffd0dc);
    in_RDI->refcount = (int *)pLVar2;
    in_stack_ffffffffffffd1d8 = local_918;
    ParamDict::ParamDict(in_stack_ffffffffffffd110);
    (**(code **)(*(long *)in_RDI->refcount + 0x10))(in_RDI->refcount,in_stack_ffffffffffffd1d8);
    ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffd0e0);
  }
  else if (*(int *)((long)&in_RDI[3].c + *(long *)((long)in_RDI->data + -0x18)) == 2) {
    pLVar2 = create_layer(in_stack_ffffffffffffd0dc);
    in_RDI->refcount = (int *)pLVar2;
    ParamDict::ParamDict(in_stack_ffffffffffffd110);
    in_stack_ffffffffffffd1d0 =
         Mat::operator[]((Mat *)((long)&in_RDI[3].cstep + *(long *)((long)in_RDI->data + -0x18)),0);
    ParamDict::set(&local_1228,0,*in_stack_ffffffffffffd1d0);
    (**(code **)(*(long *)in_RDI->refcount + 0x10))(in_RDI->refcount,&local_1228);
    ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffd0e0);
  }
  else if (*(int *)((long)&in_RDI[3].c + *(long *)((long)in_RDI->data + -0x18)) == 3) {
    pLVar2 = create_layer(in_stack_ffffffffffffd0dc);
    in_RDI->refcount = (int *)pLVar2;
    ParamDict::ParamDict(in_stack_ffffffffffffd110);
    if ((*(byte *)((long)&in_RDI[8].data + *(long *)((long)in_RDI->data + -0x18)) & 1) == 0) {
      pfVar3 = Mat::operator[]((Mat *)((long)&in_RDI[3].cstep +
                                      *(long *)((long)in_RDI->data + -0x18)),0);
      ParamDict::set(&local_1b28,0,*pfVar3);
      pfVar3 = Mat::operator[]((Mat *)((long)&in_RDI[3].cstep +
                                      *(long *)((long)in_RDI->data + -0x18)),1);
      ParamDict::set(&local_1b28,1,*pfVar3);
    }
    else {
      pfVar3 = Mat::operator[]((Mat *)((long)&in_RDI[3].cstep +
                                      *(long *)((long)in_RDI->data + -0x18)),0);
      ParamDict::set(&local_1b28,0,
                     *pfVar3 * *(float *)((long)&in_RDI[7].cstep +
                                         *(long *)((long)in_RDI->data + -0x18) + 4));
      pfVar3 = Mat::operator[]((Mat *)((long)&in_RDI[3].cstep +
                                      *(long *)((long)in_RDI->data + -0x18)),1);
      ParamDict::set(&local_1b28,1,
                     *pfVar3 * *(float *)((long)&in_RDI[7].cstep +
                                         *(long *)((long)in_RDI->data + -0x18) + 4));
    }
    (**(code **)(*(long *)in_RDI->refcount + 0x10))(in_RDI->refcount,&local_1b28);
    ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffd0e0);
  }
  else if (*(int *)((long)&in_RDI[3].c + *(long *)((long)in_RDI->data + -0x18)) == 4) {
    pLVar2 = create_layer(in_stack_ffffffffffffd0dc);
    in_RDI->refcount = (int *)pLVar2;
    ParamDict::ParamDict(in_stack_ffffffffffffd110);
    (**(code **)(*(long *)in_RDI->refcount + 0x10))(in_RDI->refcount,local_2428);
    ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffd0e0);
  }
  if (in_RDI->refcount != (int *)0x0) {
    (**(code **)(*(long *)in_RDI->refcount + 0x20))(in_RDI->refcount,local_18);
  }
  if (((*(byte *)(local_18 + 0x1a) & 1) == 0) ||
     (*(long *)((long)&in_RDI[5].refcount + *(long *)((long)in_RDI->data + -0x18)) != 1)) {
    local_242c = *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) *
                 *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18));
    uVar1 = (long)*(int *)((long)&in_RDI[3].w + *(long *)((long)in_RDI->data + -0x18)) /
            (long)local_242c;
    local_2430 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                      (long)*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18))
                      );
    *(undefined1 *)&in_RDI->elemsize = 0;
    if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) ==
          *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18))) &&
        (((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) != 1 &&
          (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) ==
           *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4))) &&
         (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1))))
       && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) == 1)) {
      pLVar2 = create_layer(in_stack_ffffffffffffd0dc);
      *(Layer **)&in_RDI[2].h = pLVar2;
      ParamDict::ParamDict(in_stack_ffffffffffffd110);
      ParamDict::set((ParamDict *)(auStack_2d38 + 8),0,
                     *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)));
      ParamDict::set((ParamDict *)(auStack_2d38 + 8),1,
                     *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4));
      ParamDict::set((ParamDict *)(auStack_2d38 + 8),0xb,
                     *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)));
      ParamDict::set((ParamDict *)(auStack_2d38 + 8),2,1);
      ParamDict::set((ParamDict *)(auStack_2d38 + 8),0xc,1);
      ParamDict::set((ParamDict *)(auStack_2d38 + 8),3,1);
      ParamDict::set((ParamDict *)(auStack_2d38 + 8),0xd,1);
      ParamDict::set((ParamDict *)(auStack_2d38 + 8),4,0);
      ParamDict::set((ParamDict *)(auStack_2d38 + 8),0xe,0);
      ParamDict::set((ParamDict *)(auStack_2d38 + 8),5,
                     *(int *)((long)&in_RDI[3].dims + *(long *)((long)in_RDI->data + -0x18)));
      ParamDict::set((ParamDict *)(auStack_2d38 + 8),6,
                     *(int *)((long)&in_RDI[3].w + *(long *)((long)in_RDI->data + -0x18)));
      (**(code **)(**(long **)&in_RDI[2].h + 0x10))(*(long **)&in_RDI[2].h,auStack_2d38 + 8);
      if (*(int *)((long)&in_RDI[3].dims + *(long *)((long)in_RDI->data + -0x18)) == 0) {
        local_2ed0 = &local_2e08;
        do {
          Mat::Mat(local_2ed0);
          local_2ed0 = local_2ed0 + 1;
        } while (local_2ed0 != (Mat *)local_2dc8);
        Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffd0dc,in_stack_ffffffffffffd0d8),
                       in_stack_ffffffffffffd0d0);
        plVar4 = *(long **)&in_RDI[2].h;
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)in_stack_ffffffffffffd0d0,in_stack_ffffffffffffd0c8);
        (**(code **)(*plVar4 + 0x18))(plVar4,&stack0xffffffffffffd1e8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x1345e2);
        local_2ef8 = (Mat *)local_2dc8;
        do {
          local_2ef8 = local_2ef8 + -1;
          Mat::~Mat((Mat *)0x13460b);
        } while (local_2ef8 != &local_2e08);
      }
      else {
        local_2e68 = (Mat *)(local_2dc8 + 0x10);
        do {
          Mat::Mat(local_2e68);
          local_2e68 = local_2e68 + 1;
        } while (local_2e68 != (Mat *)auStack_2d38);
        Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffd0dc,in_stack_ffffffffffffd0d8),
                       in_stack_ffffffffffffd0d0);
        Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffd0dc,in_stack_ffffffffffffd0d8),
                       in_stack_ffffffffffffd0d0);
        plVar4 = *(long **)&in_RDI[2].h;
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)in_stack_ffffffffffffd0d0,in_stack_ffffffffffffd0c8);
        (**(code **)(*plVar4 + 0x18))(plVar4,local_2dc8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x1343c5);
        local_2e90 = auStack_2d38;
        do {
          local_2e90 = local_2e90 + -0x40;
          Mat::~Mat((Mat *)0x1343fc);
        } while (local_2e90 != local_2dc8 + 0x10);
      }
      (**(code **)(**(long **)&in_RDI[2].h + 0x20))(*(long **)&in_RDI[2].h,local_18);
      ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffd0e0);
    }
    else if (((((*(byte *)(local_18 + 0x18) & 1) == 0) ||
              (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) != 3))
             || ((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) != 3 ||
                 ((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) != 1
                  || (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) !=
                      1)))))) ||
            ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) != 1
             || (((*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) != 1
                  || (local_2430 < 0x10)) ||
                 (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) < 0x10)))
             ))) {
      conv_im2col_sgemm_transform_kernel_sse
                (in_stack_ffffffffffffd1f0,in_stack_ffffffffffffd1e8,(int)((ulong)in_RDI >> 0x20),
                 (int)in_RDI,(int)((ulong)in_stack_ffffffffffffd1d8 >> 0x20));
    }
    else {
      *(undefined1 *)&in_RDI->elemsize = 1;
      conv3x3s1_winograd23_transform_kernel_sse
                (in_RDI,in_stack_ffffffffffffd1d8,(int)((ulong)in_stack_ffffffffffffd1d0 >> 0x20),
                 (int)in_stack_ffffffffffffd1d0);
      conv_im2col_sgemm_transform_kernel_sse
                (in_stack_ffffffffffffd1f0,in_stack_ffffffffffffd1e8,(int)((ulong)in_RDI >> 0x20),
                 (int)in_RDI,(int)((ulong)in_stack_ffffffffffffd1d8 >> 0x20));
    }
    local_4 = 0;
  }
  else {
    local_4 = create_pipeline_int8_x86
                        (in_stack_ffffffffffffd0e0,
                         (Option *)CONCAT44(in_stack_ffffffffffffd0dc,in_stack_ffffffffffffd0d8));
  }
  return local_4;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (activation_type == 1)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 2)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// slope
        activation->load_param(pd);
    }
    else if (activation_type == 3)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Clip);

        ncnn::ParamDict pd;
        if (use_int8_requantize)
        {
            pd.set(0, activation_params[0] * top_blob_int8_scale);// min
            pd.set(1, activation_params[1] * top_blob_int8_scale);// max
        }else{
            pd.set(0, activation_params[0]);// min
            pd.set(1, activation_params[1]);// max
        }

        activation->load_param(pd);
    }
    else if (activation_type == 4)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Sigmoid);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }

    if (activation)
    {
        activation->create_pipeline(opt);
    }

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    use_winograd3x3 = false;

    if (kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output);// num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);// stride_w
        pd.set(13, 1);// stride_h
        pd.set(4, 0);// pad_w
        pd.set(14, 0);// pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);
    }
    else if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1
        && num_input >= 16 && num_output >= 16)
    {
        // winograd is slow on small channel count
        use_winograd3x3 = true;

        conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
//         conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_3x3_winograd43_data, num_input, num_output);

        // for small size
        conv_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_size);
    }
    else
    {
        conv_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_size);
    }

    return 0;
}